

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O2

void cmp_C1(void)

{
  ubyte uVar1;
  
  except = '\0';
  uVar1 = getbyte(pc);
  temp2 = uVar1 + x_reg;
  temp1 = getbyte(CONCAT11(RAM[(byte)(temp2 + 1)],RAM[temp2]));
  _AL = acc;
  _AH = temp1;
  carry_f = '\x01';
  result_f = '@';
  pc = pc + 1;
  return;
}

Assistant:

void cmp_C1(void) {
    uint flags;
    CLE;
    temp2 = getbyte(pc) + x_reg;
    temp1 = getbyte(RAM[temp2] + 0x100 * RAM[(ubyte) (temp2 + 1)]);

    asm("push ax");

    asm("CLC");
    if (!carry_f) asm("STC");

    _AL = acc;
    _AH = temp1;

    asm("cmp AL,AH");
    asm("pushf");
    asm("pop flags");
    asm("pop AX");

    carry_f = (flags & 1) ^ 1;
    result_f = flags & 0xC0;
    result_f ^= 0x40;

    pc++;
}